

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chared.c
# Opt level: O0

wchar_t c_hpos(EditLine *el)

{
  bool bVar1;
  wchar_t *local_20;
  wchar_t *ptr;
  EditLine *el_local;
  
  if ((el->el_line).cursor == (el->el_line).buffer) {
    el_local._4_4_ = L'\0';
  }
  else {
    local_20 = (el->el_line).cursor;
    do {
      local_20 = local_20 + -1;
      bVar1 = false;
      if ((el->el_line).buffer <= local_20) {
        bVar1 = *local_20 != L'\n';
      }
    } while (bVar1);
    el_local._4_4_ = (int)((long)(el->el_line).cursor - (long)local_20 >> 2) + L'\xffffffff';
  }
  return el_local._4_4_;
}

Assistant:

libedit_private int
c_hpos(EditLine *el)
{
	wchar_t *ptr;

	/*
	 * Find how many characters till the beginning of this line.
	 */
	if (el->el_line.cursor == el->el_line.buffer)
		return 0;
	else {
		for (ptr = el->el_line.cursor - 1;
		     ptr >= el->el_line.buffer && *ptr != '\n';
		     ptr--)
			continue;
		return (int)(el->el_line.cursor - ptr - 1);
	}
}